

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O2

shared_ptr<pstore::index::details::internal_node> __thiscall
anon_unknown.dwarf_13be9a::CorruptInternalNodes::load_inode
          (CorruptInternalNodes *this,index_pointer ptr)

{
  typed_address<pstore::index::details::internal_node> size;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pstore::index::details::internal_node> sVar1;
  index_pointer ptr_local;
  
  if ((in_RDX & 1) != 0) {
    size = pstore::index::details::index_pointer::
           untag_address<pstore::index::details::internal_node,void>
                     ((index_pointer *)&ptr_local.addr_);
    pstore::database::getrw
              ((database *)&stack0xffffffffffffffd8,(address)&ptr.internal_[2].bitmap_,
               (size_t)size.a_.a_);
    std::static_pointer_cast<pstore::index::details::internal_node,void>((shared_ptr<void> *)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
    sVar1.super___shared_ptr<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar1.super___shared_ptr<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (shared_ptr<pstore::index::details::internal_node>)
           sVar1.
           super___shared_ptr<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>;
  }
  pstore::assert_failed
            ("ptr.is_internal ()",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
             ,0x6b0);
}

Assistant:

std::shared_ptr<internal_node> CorruptInternalNodes::load_inode (index_pointer ptr) {
        PSTORE_ASSERT (ptr.is_internal ());
        return std::static_pointer_cast<internal_node> (
            db_.getrw (ptr.untag_address<internal_node> ().to_address (),
                       internal_node::size_bytes (internal_node_children)));
    }